

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

bool __thiscall
wallet::WalletBatch::WriteAddressReceiveRequest
          (WalletBatch *this,CTxDestination *dest,string *id,string *receive_request)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  EncodeDestination_abi_cxx11_(&local_f8,dest);
  std::operator+(&local_118,"rr",id);
  paVar1 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p == paVar1) {
    local_c8._8_4_ = local_f8.field_2._8_4_;
    local_c8._12_4_ = local_f8.field_2._12_4_;
    local_d8 = &local_c8;
  }
  else {
    local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_f8._M_dataplus._M_p;
  }
  local_c8._M_allocated_capacity._4_4_ = local_f8.field_2._M_allocated_capacity._4_4_;
  local_c8._M_allocated_capacity._0_4_ = local_f8.field_2._M_allocated_capacity._0_4_;
  local_d0 = local_f8._M_string_length;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity._0_4_ =
       local_f8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p == &local_118.field_2) {
    local_a8._8_4_ = local_118.field_2._8_4_;
    local_a8._12_4_ = local_118.field_2._12_4_;
    local_b8 = &local_a8;
  }
  else {
    local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_118._M_dataplus._M_p;
  }
  local_a8._M_allocated_capacity._4_4_ = local_118.field_2._M_allocated_capacity._4_4_;
  local_a8._M_allocated_capacity._0_4_ = local_118.field_2._M_allocated_capacity._0_4_;
  local_b0 = local_118._M_string_length;
  local_118._M_string_length = 0;
  local_118.field_2._M_allocated_capacity._0_4_ =
       local_118.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_98.first._M_dataplus._M_p = (pointer)&local_98.first.field_2;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,DBKeys::DESTDATA_abi_cxx11_,
             DAT_006b90f0 + DBKeys::DESTDATA_abi_cxx11_);
  paVar2 = &local_98.second.first.field_2;
  if (local_d8 == &local_c8) {
    local_98.second.first.field_2._8_8_ = CONCAT44(local_c8._12_4_,local_c8._8_4_);
    local_98.second.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.second.first._M_dataplus._M_p = (pointer)local_d8;
  }
  local_98.second.first.field_2._M_allocated_capacity = local_c8._M_allocated_capacity;
  paVar3 = &local_98.second.second.field_2;
  local_98.second.first._M_string_length = local_d0;
  local_d0 = 0;
  local_c8._M_allocated_capacity = local_c8._M_allocated_capacity & 0xffffffffffffff00;
  if (local_b8 == &local_a8) {
    local_98.second.second.field_2._8_8_ = CONCAT44(local_a8._12_4_,local_a8._8_4_);
    local_98.second.second._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_98.second.second._M_dataplus._M_p = (pointer)local_b8;
  }
  local_98.second.second.field_2._M_allocated_capacity = local_a8._M_allocated_capacity;
  local_98.second.second._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_allocated_capacity = local_a8._M_allocated_capacity & 0xffffffffffffff00;
  local_d8 = &local_c8;
  local_b8 = &local_a8;
  bVar4 = WriteIC<std::pair<std::__cxx11::string,std::pair<std::__cxx11::string,std::__cxx11::string>>,std::__cxx11::string>
                    (this,&local_98,receive_request,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.second.second._M_dataplus._M_p != paVar3) {
    operator_delete(local_98.second.second._M_dataplus._M_p,
                    local_98.second.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.second.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.second.first._M_dataplus._M_p,
                    local_98.second.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.first._M_dataplus._M_p != &local_98.first.field_2) {
    operator_delete(local_98.first._M_dataplus._M_p,local_98.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT44(local_118.field_2._M_allocated_capacity._4_4_,
                             local_118.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT44(local_f8.field_2._M_allocated_capacity._4_4_,
                             local_f8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteAddressReceiveRequest(const CTxDestination& dest, const std::string& id, const std::string& receive_request)
{
    return WriteIC(std::make_pair(DBKeys::DESTDATA, std::make_pair(EncodeDestination(dest), "rr" + id)), receive_request);
}